

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

cgltf_bool
cgltf_accessor_read_uint
          (cgltf_accessor *accessor,cgltf_size index,cgltf_uint *out,cgltf_size element_size)

{
  uint8_t *element;
  cgltf_size offset;
  cgltf_size element_size_local;
  cgltf_uint *out_local;
  cgltf_size index_local;
  cgltf_accessor *accessor_local;
  
  if (accessor->is_sparse == 0) {
    if (accessor->buffer_view == (cgltf_buffer_view *)0x0) {
      memset(out,0,element_size << 2);
      accessor_local._4_4_ = 1;
    }
    else if (accessor->buffer_view->buffer->data == (void *)0x0) {
      accessor_local._4_4_ = 0;
    }
    else {
      accessor_local._4_4_ =
           cgltf_element_read_uint
                     ((uint8_t *)
                      (accessor->offset + accessor->buffer_view->offset + accessor->stride * index +
                      (long)accessor->buffer_view->buffer->data),accessor->type,
                      accessor->component_type,out,element_size);
    }
  }
  else {
    accessor_local._4_4_ = 0;
  }
  return accessor_local._4_4_;
}

Assistant:

cgltf_bool cgltf_accessor_read_uint(const cgltf_accessor* accessor, cgltf_size index, cgltf_uint* out, cgltf_size element_size)
{
    if (accessor->is_sparse)
    {
        return 0;
    }
    if (accessor->buffer_view == NULL)
    {
        memset(out, 0, element_size * sizeof( cgltf_uint ));
        return 1;
    }
    if (accessor->buffer_view->buffer->data == NULL)
    {
        return 0;
    }
    cgltf_size offset = accessor->offset + accessor->buffer_view->offset;
    const uint8_t* element = (const uint8_t*) accessor->buffer_view->buffer->data;
    element += offset + accessor->stride * index;
    return cgltf_element_read_uint(element, accessor->type, accessor->component_type, out, element_size);
}